

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O1

void CheckSceneAverage(string *filename,float expected)

{
  bool bVar1;
  Allocator alloc;
  int c;
  int c_00;
  char *pcVar2;
  char *in_R9;
  ulong uVar3;
  long lVar4;
  Float FVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  optional<pbrt::ImageAndMetadata> im;
  AssertHelper in_stack_fffffffffffffc58;
  AssertHelper expr2;
  Message in_stack_fffffffffffffc60;
  undefined4 uVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  expr1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  undefined4 in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  AssertHelper in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  ColorEncodingHandle local_370;
  undefined1 local_368 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_330;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_310;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_2f0;
  bool local_2cc;
  bool local_288;
  bool local_244;
  bool local_230;
  bool local_224;
  bool local_21c;
  bool local_214;
  bool local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_200;
  optional<pbrt::ImageAndMetadata> local_1d0;
  
  uVar6 = in_stack_fffffffffffffc60.ss_.ptr_._4_4_;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_370.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_368,filename,alloc,&local_370);
  local_1d0.set = true;
  pbrt::ImageAndMetadata::ImageAndMetadata
            ((ImageAndMetadata *)&local_1d0,(ImageAndMetadata *)local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_200);
  if (local_208 == true) {
    local_208 = false;
  }
  if (local_214 == true) {
    local_214 = false;
  }
  if (local_21c == true) {
    local_21c = false;
  }
  if (local_224 == true) {
    local_224 = false;
  }
  if (local_230 == true) {
    local_230 = false;
  }
  if (local_244 == true) {
    local_244 = false;
  }
  if (local_288 == true) {
    local_288 = false;
  }
  if (local_2cc == true) {
    local_2cc = false;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_2f0);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_310);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&local_330)
  ;
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  local_398.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1d0.set == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffc58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_368,(internal *)&stack0xfffffffffffffc60,
               (AssertionResult *)"(bool)im","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
               ,0x34,(char *)CONCAT71(local_368._1_7_,local_368[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc78,(Message *)&stack0xfffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc78);
    if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_368._1_7_,local_368[0]) != &local_358) {
      operator_delete((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(local_368._1_7_,local_368[0]),
                      (ulong)((long)local_358.alloc.memoryResource + 1));
    }
    if (((in_stack_fffffffffffffc58.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (in_stack_fffffffffffffc58.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)in_stack_fffffffffffffc58.data_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_1d0.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
    }
    expr1.ptr_._4_4_ = uVar6;
    expr1.ptr_._0_4_ = local_1d0.optionalValue._40_4_;
    expr2.data_._4_4_ = (undefined4)((ulong)in_stack_fffffffffffffc58.data_ >> 0x20);
    expr2.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_368,"im->image.NChannels()","3",(int *)&stack0xfffffffffffffc60,
               (int *)&stack0xfffffffffffffc58);
    if (local_368[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc60);
      if ((undefined8 *)local_368._8_8_ == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_368._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
                 ,0x35,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc58,(Message *)&stack0xfffffffffffffc60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc58);
      if (((expr1.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_1d0.set != true) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
      }
      if (0 < (int)local_1d0.optionalValue._8_4_) {
        in_stack_fffffffffffffc74 = 0.0;
        lVar4 = 0;
        do {
          if (0 < (int)local_1d0.optionalValue._4_4_) {
            uVar3 = 0;
            do {
              c_00 = 0;
              do {
                FVar5 = pbrt::Image::GetChannel
                                  ((Image *)&local_1d0,(Point2i)(lVar4 << 0x20 | uVar3),c_00,
                                   (WrapMode2D)0x200000002);
                in_stack_fffffffffffffc74 = in_stack_fffffffffffffc74 + FVar5;
                c_00 = c_00 + 1;
              } while (c_00 != 3);
              uVar3 = uVar3 + 1;
            } while ((long)uVar3 < (long)(int)local_1d0.optionalValue._4_4_);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)local_1d0.optionalValue._8_4_);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)expr1.ptr_,(char *)expr2.data_,(char *)0x27bb7b,
                 (double)CONCAT44(expected,in_stack_fffffffffffffc80),
                 (double)in_stack_fffffffffffffc78.data_,
                 (double)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
      if (local_368[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xfffffffffffffc60);
        if ((undefined8 *)local_368._8_8_ == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_368._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffc58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
                   ,0x40,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffc58,(Message *)&stack0xfffffffffffffc60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc58);
        if (((expr1.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           (expr1.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)expr1.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  pstd::optional<pbrt::ImageAndMetadata>::reset(&local_1d0);
  return;
}

Assistant:

void CheckSceneAverage(const std::string &filename, float expected) {
    pstd::optional<ImageAndMetadata> im = Image::Read(filename);
    ASSERT_TRUE((bool)im);
    ASSERT_EQ(im->image.NChannels(), 3);

    float delta = .025;
    float sum = 0;

    Image &image = im->image;
    for (int t = 0; t < image.Resolution()[1]; ++t)
        for (int s = 0; s < image.Resolution()[0]; ++s)
            for (int c = 0; c < 3; ++c)
                sum += image.GetChannel(Point2i(s, t), c);
    int nPixels = image.Resolution().x * image.Resolution().y * 3;
    EXPECT_NEAR(expected, sum / nPixels, delta);
}